

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

void absl::numbers_internal::PutTwoDigits(uint32_t i,Nonnull<char_*> buf)

{
  uint in_EDI;
  uint32_t mod10;
  uint32_t div10;
  uint32_t base;
  uint16_t in_stack_ffffffffffffffde;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_EDI < 100) {
    little_endian::Store16
              ((Nonnull<void_*>)
               CONCAT44(in_EDI + (int)((ulong)in_EDI * 0x67 >> 10) * -10,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffde);
    return;
  }
  __assert_fail("i < 100",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                ,0x11f,"void absl::numbers_internal::PutTwoDigits(uint32_t, absl::Nonnull<char *>)")
  ;
}

Assistant:

void numbers_internal::PutTwoDigits(uint32_t i, absl::Nonnull<char*> buf) {
  assert(i < 100);
  uint32_t base = kTwoZeroBytes;
  uint32_t div10 = (i * kDivisionBy10Mul) / kDivisionBy10Div;
  uint32_t mod10 = i - 10u * div10;
  base += div10 + (mod10 << 8);
  little_endian::Store16(buf, static_cast<uint16_t>(base));
}